

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

void Gia_ManCheckSuppUnmark_rec(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *(ulong *)pObj;
  uVar2 = (uint)uVar1;
  while (((uVar2 >> 0x1e & 1) != 0 &&
         (*(ulong *)pObj = uVar1 & 0xffffffffbfffffff, (~(uint)uVar1 & 0x9fffffff) != 0))) {
    Gia_ManCheckSuppUnmark_rec(p,pObj + -(uVar1 & 0x1fffffff));
    pObj = pObj + -((ulong)*(uint *)&pObj->field_0x4 & 0x1fffffff);
    uVar1 = *(ulong *)pObj;
    uVar2 = (uint)uVar1;
  }
  return;
}

Assistant:

void Gia_ManCheckSuppUnmark_rec( Gia_Man_t * p, Gia_Obj_t * pObj )
{
    if ( !pObj->fMark0 )
        return;
    pObj->fMark0 = 0;
    if ( Gia_ObjIsCi(pObj) )
        return;
    Gia_ManCheckSuppUnmark_rec( p, Gia_ObjFanin0(pObj) );
    Gia_ManCheckSuppUnmark_rec( p, Gia_ObjFanin1(pObj) );
}